

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c14n.c
# Opt level: O1

xmlChar * xmlC11NNormalizeString(xmlChar *input,xmlC14NNormalizationMode mode)

{
  xmlChar xVar1;
  bool bVar2;
  xmlChar *pxVar3;
  xmlChar *pxVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  xmlChar *pxVar8;
  xmlChar *pxVar9;
  
  if ((input == (xmlChar *)0x0) ||
     (pxVar3 = (xmlChar *)(*xmlMalloc)(1000), pxVar3 == (xmlChar *)0x0)) {
LAB_00160983:
    pxVar9 = (xmlChar *)0x0;
  }
  else {
    pxVar9 = pxVar3;
    if (*input != '\0') {
      pxVar8 = input + 1;
      iVar7 = 1000;
      do {
        if ((long)(iVar7 + -10) < (long)pxVar3 - (long)pxVar9) {
          iVar5 = 1;
          if ((0 < iVar7) && (iVar5 = -1, iVar7 < 1000000000)) {
            uVar6 = iVar7 + 1U >> 1;
            iVar5 = uVar6 + iVar7;
            if ((int)(1000000000 - uVar6) < iVar7) {
              iVar5 = 1000000000;
            }
          }
          if ((iVar5 < 0) ||
             (pxVar4 = (xmlChar *)(*xmlRealloc)(pxVar9,(size_t)iVar5), pxVar4 == (xmlChar *)0x0)) {
            (*xmlFree)(pxVar9);
            bVar2 = false;
          }
          else {
            pxVar3 = pxVar4 + (int)((long)pxVar3 - (long)pxVar9);
            bVar2 = true;
            pxVar9 = pxVar4;
            iVar7 = iVar5;
          }
          if (!bVar2) goto LAB_00160983;
        }
        xVar1 = pxVar8[-1];
        if ((xVar1 == '<') && ((mode == XMLC14N_NORMALIZE_TEXT || (mode == XMLC14N_NORMALIZE_ATTR)))
           ) {
          builtin_memcpy(pxVar3,"&lt;",4);
LAB_0016089e:
          pxVar3 = pxVar3 + 4;
        }
        else {
          if (xVar1 == '>' && mode == XMLC14N_NORMALIZE_TEXT) {
            builtin_memcpy(pxVar3,"&gt;",4);
            goto LAB_0016089e;
          }
          if ((xVar1 == '&') &&
             ((mode == XMLC14N_NORMALIZE_TEXT || (mode == XMLC14N_NORMALIZE_ATTR)))) {
            builtin_memcpy(pxVar3,"&amp",4);
LAB_00160961:
            pxVar3[4] = ';';
            pxVar3 = pxVar3 + 5;
          }
          else {
            if (xVar1 != '\"' || mode != XMLC14N_NORMALIZE_ATTR) {
              if (xVar1 == '\t' && mode == XMLC14N_NORMALIZE_ATTR) {
                builtin_memcpy(pxVar3,"&#x9",4);
              }
              else if (xVar1 == '\n' && mode == XMLC14N_NORMALIZE_ATTR) {
                builtin_memcpy(pxVar3,"&#xA",4);
              }
              else {
                if (xVar1 != '\r' || XMLC14N_NORMALIZE_TEXT < mode) {
                  *pxVar3 = xVar1;
                  pxVar3 = pxVar3 + 1;
                  goto LAB_0016096a;
                }
                builtin_memcpy(pxVar3,"&#xD",4);
              }
              goto LAB_00160961;
            }
            builtin_memcpy(pxVar3,"&quot;",6);
            pxVar3 = pxVar3 + 6;
          }
        }
LAB_0016096a:
        xVar1 = *pxVar8;
        pxVar8 = pxVar8 + 1;
      } while (xVar1 != '\0');
    }
    *pxVar3 = '\0';
  }
  return pxVar9;
}

Assistant:

static xmlChar *
xmlC11NNormalizeString(const xmlChar * input,
                       xmlC14NNormalizationMode mode)
{
    const xmlChar *cur = input;
    xmlChar *buffer = NULL;
    xmlChar *out = NULL;
    int buffer_size = 0;

    if (input == NULL)
        return (NULL);

    /*
     * allocate an translation buffer.
     */
    buffer_size = 1000;
    buffer = xmlMalloc(buffer_size);
    if (buffer == NULL)
        return (NULL);
    out = buffer;

    while (*cur != '\0') {
        if ((out - buffer) > (buffer_size - 10)) {
            xmlChar *tmp;
            int indx = out - buffer;
            int newSize;

            newSize = xmlGrowCapacity(buffer_size, 1, 1, XML_MAX_ITEMS);
            if (newSize < 0) {
                xmlFree(buffer);
                return(NULL);
            }
            tmp = xmlRealloc(buffer, newSize);
            if (tmp == NULL) {
                xmlFree(buffer);
                return(NULL);
            }
            buffer = tmp;
            buffer_size = newSize;
            out = &buffer[indx];
        }

        if ((*cur == '<') && ((mode == XMLC14N_NORMALIZE_ATTR) ||
                              (mode == XMLC14N_NORMALIZE_TEXT))) {
            *out++ = '&';
            *out++ = 'l';
            *out++ = 't';
            *out++ = ';';
        } else if ((*cur == '>') && (mode == XMLC14N_NORMALIZE_TEXT)) {
            *out++ = '&';
            *out++ = 'g';
            *out++ = 't';
            *out++ = ';';
        } else if ((*cur == '&') && ((mode == XMLC14N_NORMALIZE_ATTR) ||
                                     (mode == XMLC14N_NORMALIZE_TEXT))) {
            *out++ = '&';
            *out++ = 'a';
            *out++ = 'm';
            *out++ = 'p';
            *out++ = ';';
        } else if ((*cur == '"') && (mode == XMLC14N_NORMALIZE_ATTR)) {
            *out++ = '&';
            *out++ = 'q';
            *out++ = 'u';
            *out++ = 'o';
            *out++ = 't';
            *out++ = ';';
        } else if ((*cur == '\x09') && (mode == XMLC14N_NORMALIZE_ATTR)) {
            *out++ = '&';
            *out++ = '#';
            *out++ = 'x';
            *out++ = '9';
            *out++ = ';';
        } else if ((*cur == '\x0A') && (mode == XMLC14N_NORMALIZE_ATTR)) {
            *out++ = '&';
            *out++ = '#';
            *out++ = 'x';
            *out++ = 'A';
            *out++ = ';';
        } else if ((*cur == '\x0D') && ((mode == XMLC14N_NORMALIZE_ATTR) ||
                                        (mode == XMLC14N_NORMALIZE_TEXT) ||
                                        (mode == XMLC14N_NORMALIZE_COMMENT) ||
					(mode == XMLC14N_NORMALIZE_PI))) {
            *out++ = '&';
            *out++ = '#';
            *out++ = 'x';
            *out++ = 'D';
            *out++ = ';';
        } else {
            /*
             * Works because on UTF-8, all extended sequences cannot
             * result in bytes in the ASCII range.
             */
            *out++ = *cur;
        }
        cur++;
    }
    *out = 0;
    return (buffer);
}